

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O1

int __thiscall bhf::ads::SymbolAccess::Write(SymbolAccess *this,string *name,string *value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  const_iterator cVar4;
  ostream *poVar5;
  SymbolEntry entry;
  SymbolEntryMap entries;
  stringstream stream;
  undefined1 local_288 [32];
  _Alloc_hider local_268;
  char local_258 [16];
  _Alloc_hider local_248;
  size_type local_240;
  char local_238 [16];
  _Alloc_hider local_228;
  char local_218 [16];
  string local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  FetchSymbolEntries_abi_cxx11_((SymbolEntryMap *)&local_1e8,this);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
          ::find(&local_1e8,name);
  if ((_Rb_tree_header *)cVar4._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Write",5);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(): symbol \'",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' not found\n",0xc);
    std::__cxx11::stringbuf::str();
    Logger::Log(2,(string *)local_288);
    if ((undefined1 *)CONCAT44(local_288._4_4_,local_288._0_4_) != local_288 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_288._4_4_,local_288._0_4_));
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    iVar3 = 0x710;
    goto LAB_00125d10;
  }
  local_288._0_4_ = cVar4._M_node[2]._M_color;
  local_288._4_4_ = *(undefined4 *)&cVar4._M_node[2].field_0x4;
  local_288._8_4_ = *(undefined4 *)&cVar4._M_node[2]._M_parent;
  uVar1 = *(undefined4 *)((long)&cVar4._M_node[2]._M_parent + 4);
  uVar2 = *(undefined4 *)((long)&cVar4._M_node[2]._M_left + 2);
  local_288._22_4_ = *(undefined4 *)((long)&cVar4._M_node[2]._M_left + 6);
  local_288._26_4_ = *(undefined4 *)((long)&cVar4._M_node[2]._M_right + 2);
  local_288._16_2_ =
       (undefined2)((uint)*(undefined4 *)((long)&cVar4._M_node[2]._M_parent + 6) >> 0x10);
  local_288._18_2_ = (undefined2)uVar2;
  local_288._20_2_ = (undefined2)((uint)uVar2 >> 0x10);
  local_288._12_2_ = (undefined2)uVar1;
  local_288._14_2_ = (undefined2)((uint)uVar1 >> 0x10);
  local_268._M_p = local_258;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,*(long *)(cVar4._M_node + 3),
             (long)&(cVar4._M_node[3]._M_parent)->_M_color + *(long *)(cVar4._M_node + 3));
  local_248._M_p = local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,*(long *)(cVar4._M_node + 4),
             (long)&(cVar4._M_node[4]._M_parent)->_M_color + *(long *)(cVar4._M_node + 4));
  local_228._M_p = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,*(long *)(cVar4._M_node + 5),
             (long)&(cVar4._M_node[5]._M_parent)->_M_color + *(long *)(cVar4._M_node + 5));
  switch(CONCAT22(local_288._18_2_,local_288._16_2_)) {
  case 2:
    iVar3 = Write<short>(this,(SymbolEntry *)local_288,value);
    break;
  case 3:
    iVar3 = Write<int>(this,(SymbolEntry *)local_288,value);
    break;
  case 4:
    iVar3 = Write<float>(this,(SymbolEntry *)local_288,value);
    break;
  case 5:
    iVar3 = Write<double>(this,(SymbolEntry *)local_288,value);
    break;
  case 0x11:
switchD_00125ac4_caseD_11:
    iVar3 = Write<unsigned_char>(this,(SymbolEntry *)local_288,value);
    break;
  case 0x12:
    iVar3 = Write<unsigned_short>(this,(SymbolEntry *)local_288,value);
    break;
  case 0x13:
    iVar3 = Write<unsigned_int>(this,(SymbolEntry *)local_288,value);
    break;
  case 0x15:
    iVar3 = Write<unsigned_long>(this,(SymbolEntry *)local_288,value);
    break;
  default:
    if (CONCAT22(local_288._18_2_,local_288._16_2_) == 0x21) goto switchD_00125ac4_caseD_11;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Write",5);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"() Unknown type \'",0x11);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_248._M_p,local_240);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' writting as string\n",0x15);
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    iVar3 = Write<std::__cxx11::string>(this,(SymbolEntry *)local_288,value);
  }
  if (local_228._M_p != local_218) {
    operator_delete(local_228._M_p);
  }
  if (local_248._M_p != local_238) {
    operator_delete(local_248._M_p);
  }
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
LAB_00125d10:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  ::~_Rb_tree(&local_1e8);
  return iVar3;
}

Assistant:

int SymbolAccess::Write(const std::string& name, const std::string& value) const
{
    const auto entries = FetchSymbolEntries();
    const auto it = entries.find(name);
    if (it == entries.end()) {
        LOG_WARN(__FUNCTION__ << "(): symbol '" << name << "' not found\n");
        return ADSERR_DEVICE_SYMBOLNOTFOUND;
    }

    const auto entry = it->second;

    switch (entry.header.dataType) {
    case 0x2:     //INT
        return Write<int16_t>(entry, value);

    case 0x3:     //DINT
        return Write<int32_t>(entry, value);

    case 0x4:     //REAL
        return Write<float>(entry, value);

    case 0x5:     //LREAL
        return Write<double>(entry, value);

    case 0x11:     // BYTE
    case 0x21:     // BOOL
        return Write<uint8_t>(entry, value);

    case 0x12:     // WORD, UINT
        return Write<uint16_t>(entry, value);

    case 0x13:     // DWORD, UDINT
        return Write<uint32_t>(entry, value);

    case 0x15:     // LWORD, ULINT
        return Write<uint64_t>(entry, value);

    default:
        LOG_WARN(__FUNCTION__ << "() Unknown type '" << entry.typeName << "' writting as string\n");
        return Write<std::string>(entry, value);
    }
}